

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O3

void __thiscall
Indexing::CodeTree::Compiler<true>::handleVar
          (Compiler<true> *this,uint var,Stack<unsigned_int> *globalCounterparts)

{
  Stack<Indexing::CodeTree::CodeOp> *pSVar1;
  bool bVar2;
  CodeOp *pCVar3;
  uint *puVar4;
  uint uVar5;
  uint *varNumPtr;
  uint *globalVarNumPtr;
  uint *local_38;
  uint *local_30;
  
  bVar2 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::getValuePtr
                    (&this->varMap,var,&local_38);
  if (bVar2) {
    uVar5 = this->nextVarNum;
    this->nextVarNum = uVar5 + 1;
    *local_38 = uVar5;
    pSVar1 = this->code;
    pCVar3 = pSVar1->_cursor;
    if (pCVar3 == pSVar1->_end) {
      Lib::Stack<Indexing::CodeTree::CodeOp>::expand(pSVar1);
      pCVar3 = pSVar1->_cursor;
    }
    pCVar3->_content = (ulong)uVar5 * 8 + 4;
    pCVar3->_alternative = (CodeOp *)0x0;
    pSVar1->_cursor = pSVar1->_cursor + 1;
    bVar2 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::getValuePtr
                      (&this->globalVarMap,var,&local_30);
    if (bVar2) {
      uVar5 = this->nextGlobalVarNum;
      this->nextGlobalVarNum = uVar5 + 1;
      *local_30 = uVar5;
    }
    else {
      uVar5 = *local_30;
    }
    puVar4 = globalCounterparts->_cursor;
    if (puVar4 == globalCounterparts->_end) {
      Lib::Stack<unsigned_int>::expand(globalCounterparts);
      puVar4 = globalCounterparts->_cursor;
    }
    *puVar4 = uVar5;
    globalCounterparts->_cursor = puVar4 + 1;
  }
  else {
    pSVar1 = this->code;
    uVar5 = *local_38;
    pCVar3 = pSVar1->_cursor;
    if (pCVar3 == pSVar1->_end) {
      Lib::Stack<Indexing::CodeTree::CodeOp>::expand(pSVar1);
      pCVar3 = pSVar1->_cursor;
    }
    pCVar3->_content = (ulong)uVar5 * 8 + 5;
    pCVar3->_alternative = (CodeOp *)0x0;
    pSVar1->_cursor = pSVar1->_cursor + 1;
  }
  return;
}

Assistant:

void CodeTree::Compiler<forLits>::handleVar(unsigned var, Stack<unsigned>* globalCounterparts)
{
  unsigned* varNumPtr;
  if (varMap.getValuePtr(var,varNumPtr)) {
    *varNumPtr = nextVarNum++;
    code.push(CodeOp::getTermOp(ASSIGN_VAR, *varNumPtr));

    if constexpr (forLits) {
      unsigned* globalVarNumPtr;
      if (globalVarMap.getValuePtr(var,globalVarNumPtr)) {
        *globalVarNumPtr = nextGlobalVarNum++;
      }
      globalCounterparts->push(*globalVarNumPtr);
    }
  } else {
    code.push(CodeOp::getTermOp(CHECK_VAR, *varNumPtr));
  }
}